

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  int iVar54;
  ulong uVar55;
  undefined4 uVar56;
  RayK<8> *pRVar57;
  long lVar58;
  ulong uVar59;
  undefined1 (*pauVar60) [32];
  ulong uVar61;
  ulong *puVar62;
  NodeRef root;
  uint uVar63;
  bool bVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar76 [32];
  undefined1 auVar74 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar73 [16];
  undefined1 auVar75 [32];
  undefined1 auVar80 [64];
  undefined1 auVar83 [16];
  float fVar81;
  float fVar82;
  float fVar97;
  float fVar99;
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar101;
  undefined1 auVar89 [32];
  float fVar98;
  float fVar100;
  float fVar102;
  float fVar104;
  float fVar106;
  float fVar108;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar110 [16];
  float fVar109;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar121;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar120 [16];
  undefined1 auVar115 [32];
  undefined1 auVar122 [16];
  float fVar125;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar126;
  undefined1 auVar127 [16];
  uint uVar132;
  float fVar133;
  uint uVar134;
  float fVar135;
  float fVar137;
  uint uVar138;
  uint uVar139;
  float fVar140;
  uint uVar141;
  float fVar142;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar136;
  uint uVar143;
  undefined1 auVar131 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [32];
  float fVar163;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  float fVar183;
  undefined1 auVar184 [32];
  float fVar186;
  undefined1 auVar185 [64];
  undefined1 auVar188 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d11;
  BVH *local_5d10;
  Intersectors *local_5d08;
  undefined1 local_5d00 [16];
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  RayK<8> *local_5c98;
  RayQueryContext *local_5c90;
  RayK<8> *local_5c88;
  undefined1 local_5c80 [20];
  uint uStack_5c6c;
  uint uStack_5c68;
  uint uStack_5c64;
  uint local_5c60;
  undefined4 uStack_5c5c;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined1 local_5c40 [32];
  size_t local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  float fStack_5b84;
  undefined1 local_5b70 [16];
  undefined1 local_5b60 [16];
  undefined1 local_5b50 [16];
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined4 uStack_5ac4;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a80;
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [8];
  float fStack_59b8;
  float fStack_59b4;
  float fStack_59b0;
  float fStack_59ac;
  float fStack_59a8;
  undefined1 local_59a0 [8];
  float fStack_5998;
  float fStack_5994;
  float fStack_5990;
  float fStack_598c;
  float fStack_5988;
  undefined1 local_5980 [8];
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  float fStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar96 [64];
  undefined1 auVar187 [36];
  
  local_5d10 = (BVH *)This->ptr;
  local_5808 = (local_5d10->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar181 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar188 = vpcmpeqd_avx(auVar181,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar181 = vpcmpeqd_avx(auVar181,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar73 = ZEXT816(0) << 0x40;
      auVar84 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar73),5);
      auVar111._16_16_ = auVar181;
      auVar111._0_16_ = auVar188;
      auVar75 = auVar111 & auVar84;
      if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar75 >> 0x7f,0) != '\0') ||
            (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar75 >> 0xbf,0) != '\0') ||
          (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar75[0x1f] < '\0') {
        local_58a0 = vandps_avx(auVar84,auVar111);
        local_5a80._0_8_ = *(undefined8 *)ray;
        local_5a80._8_8_ = *(undefined8 *)(ray + 8);
        local_5a80._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5a80._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5a80._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5a80._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5a80._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5a80._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5a80._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5a80._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5a80._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5a80._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5a20 = *(undefined1 (*) [32])(ray + 0x80);
        local_5a00 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59e0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar153._8_4_ = 0x7fffffff;
        auVar153._0_8_ = 0x7fffffff7fffffff;
        auVar153._12_4_ = 0x7fffffff;
        auVar153._16_4_ = 0x7fffffff;
        auVar153._20_4_ = 0x7fffffff;
        auVar153._24_4_ = 0x7fffffff;
        auVar153._28_4_ = 0x7fffffff;
        auVar128._8_4_ = 0x219392ef;
        auVar128._0_8_ = 0x219392ef219392ef;
        auVar128._12_4_ = 0x219392ef;
        auVar128._16_4_ = 0x219392ef;
        auVar128._20_4_ = 0x219392ef;
        auVar128._24_4_ = 0x219392ef;
        auVar128._28_4_ = 0x219392ef;
        auVar84 = vandps_avx(auVar153,local_5a20);
        auVar84 = vcmpps_avx(auVar84,auVar128,1);
        auVar75 = vblendvps_avx(local_5a20,auVar128,auVar84);
        auVar84 = vandps_avx(auVar153,local_5a00);
        auVar84 = vcmpps_avx(auVar84,auVar128,1);
        auVar111 = vblendvps_avx(local_5a00,auVar128,auVar84);
        auVar84 = vandps_avx(auVar153,local_59e0);
        auVar84 = vcmpps_avx(auVar84,auVar128,1);
        auVar84 = vblendvps_avx(local_59e0,auVar128,auVar84);
        auVar10 = vrcpps_avx(auVar75);
        fVar2 = auVar10._0_4_;
        fVar3 = auVar10._4_4_;
        auVar11._4_4_ = auVar75._4_4_ * fVar3;
        auVar11._0_4_ = auVar75._0_4_ * fVar2;
        fVar4 = auVar10._8_4_;
        auVar11._8_4_ = auVar75._8_4_ * fVar4;
        fVar5 = auVar10._12_4_;
        auVar11._12_4_ = auVar75._12_4_ * fVar5;
        fVar6 = auVar10._16_4_;
        auVar11._16_4_ = auVar75._16_4_ * fVar6;
        fVar7 = auVar10._20_4_;
        auVar11._20_4_ = auVar75._20_4_ * fVar7;
        fVar183 = auVar10._24_4_;
        auVar11._24_4_ = auVar75._24_4_ * fVar183;
        auVar11._28_4_ = auVar75._28_4_;
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar145._16_4_ = 0x3f800000;
        auVar145._20_4_ = 0x3f800000;
        auVar145._24_4_ = 0x3f800000;
        auVar145._28_4_ = 0x3f800000;
        auVar75 = vsubps_avx(auVar145,auVar11);
        local_59c0._0_4_ = fVar2 + fVar2 * auVar75._0_4_;
        local_59c0._4_4_ = fVar3 + fVar3 * auVar75._4_4_;
        fStack_59b8 = fVar4 + fVar4 * auVar75._8_4_;
        fStack_59b4 = fVar5 + fVar5 * auVar75._12_4_;
        fStack_59b0 = fVar6 + fVar6 * auVar75._16_4_;
        fStack_59ac = fVar7 + fVar7 * auVar75._20_4_;
        fStack_59a8 = fVar183 + fVar183 * auVar75._24_4_;
        register0x0000129c = auVar10._28_4_ + auVar75._28_4_;
        auVar75 = vrcpps_avx(auVar111);
        fVar2 = auVar75._0_4_;
        fVar3 = auVar75._4_4_;
        auVar10._4_4_ = auVar111._4_4_ * fVar3;
        auVar10._0_4_ = auVar111._0_4_ * fVar2;
        fVar4 = auVar75._8_4_;
        auVar10._8_4_ = auVar111._8_4_ * fVar4;
        fVar5 = auVar75._12_4_;
        auVar10._12_4_ = auVar111._12_4_ * fVar5;
        fVar6 = auVar75._16_4_;
        auVar10._16_4_ = auVar111._16_4_ * fVar6;
        fVar7 = auVar75._20_4_;
        auVar10._20_4_ = auVar111._20_4_ * fVar7;
        fVar183 = auVar75._24_4_;
        auVar10._24_4_ = auVar111._24_4_ * fVar183;
        auVar10._28_4_ = auVar111._28_4_;
        auVar111 = vsubps_avx(auVar145,auVar10);
        local_59a0._0_4_ = fVar2 + fVar2 * auVar111._0_4_;
        local_59a0._4_4_ = fVar3 + fVar3 * auVar111._4_4_;
        fStack_5998 = fVar4 + fVar4 * auVar111._8_4_;
        fStack_5994 = fVar5 + fVar5 * auVar111._12_4_;
        fStack_5990 = fVar6 + fVar6 * auVar111._16_4_;
        fStack_598c = fVar7 + fVar7 * auVar111._20_4_;
        fStack_5988 = fVar183 + fVar183 * auVar111._24_4_;
        register0x000012dc = auVar75._28_4_ + auVar111._28_4_;
        auVar75 = vrcpps_avx(auVar84);
        fVar2 = auVar75._0_4_;
        fVar3 = auVar75._4_4_;
        auVar12._4_4_ = auVar84._4_4_ * fVar3;
        auVar12._0_4_ = auVar84._0_4_ * fVar2;
        fVar4 = auVar75._8_4_;
        auVar12._8_4_ = auVar84._8_4_ * fVar4;
        fVar5 = auVar75._12_4_;
        auVar12._12_4_ = auVar84._12_4_ * fVar5;
        fVar6 = auVar75._16_4_;
        auVar12._16_4_ = auVar84._16_4_ * fVar6;
        fVar7 = auVar75._20_4_;
        auVar12._20_4_ = auVar84._20_4_ * fVar7;
        fVar183 = auVar75._24_4_;
        auVar12._24_4_ = auVar84._24_4_ * fVar183;
        auVar12._28_4_ = auVar84._28_4_;
        auVar84 = vsubps_avx(auVar145,auVar12);
        local_5980._0_4_ = fVar2 + fVar2 * auVar84._0_4_;
        local_5980._4_4_ = fVar3 + fVar3 * auVar84._4_4_;
        fStack_5978 = fVar4 + fVar4 * auVar84._8_4_;
        fStack_5974 = fVar5 + fVar5 * auVar84._12_4_;
        fStack_5970 = fVar6 + fVar6 * auVar84._16_4_;
        fStack_596c = fVar7 + fVar7 * auVar84._20_4_;
        fStack_5968 = fVar183 + fVar183 * auVar84._24_4_;
        register0x0000131c = auVar75._28_4_ + auVar84._28_4_;
        auVar75._8_4_ = 0x20;
        auVar75._0_8_ = 0x2000000020;
        auVar75._12_4_ = 0x20;
        auVar75._16_4_ = 0x20;
        auVar75._20_4_ = 0x20;
        auVar75._24_4_ = 0x20;
        auVar75._28_4_ = 0x20;
        auVar84 = vcmpps_avx(_local_59c0,ZEXT1632(auVar73),1);
        local_5960 = vandps_avx(auVar84,auVar75);
        auVar75 = ZEXT1632(auVar73);
        auVar84 = vcmpps_avx(_local_59a0,auVar75,5);
        auVar112._8_4_ = 0x40;
        auVar112._0_8_ = 0x4000000040;
        auVar112._12_4_ = 0x40;
        auVar112._16_4_ = 0x40;
        auVar112._20_4_ = 0x40;
        auVar112._24_4_ = 0x40;
        auVar112._28_4_ = 0x40;
        auVar129._8_4_ = 0x60;
        auVar129._0_8_ = 0x6000000060;
        auVar129._12_4_ = 0x60;
        auVar129._16_4_ = 0x60;
        auVar129._20_4_ = 0x60;
        auVar129._24_4_ = 0x60;
        auVar129._28_4_ = 0x60;
        local_5940 = vblendvps_avx(auVar129,auVar112,auVar84);
        auVar84 = vcmpps_avx(_local_5980,auVar75,5);
        auVar113._8_4_ = 0x80;
        auVar113._0_8_ = 0x8000000080;
        auVar113._12_4_ = 0x80;
        auVar113._16_4_ = 0x80;
        auVar113._20_4_ = 0x80;
        auVar113._24_4_ = 0x80;
        auVar113._28_4_ = 0x80;
        auVar123._8_4_ = 0xa0;
        auVar123._0_8_ = 0xa0000000a0;
        auVar123._12_4_ = 0xa0;
        auVar123._16_4_ = 0xa0;
        auVar123._20_4_ = 0xa0;
        auVar123._24_4_ = 0xa0;
        auVar123._28_4_ = 0xa0;
        local_5920 = vblendvps_avx(auVar123,auVar113,auVar84);
        auVar84 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar75);
        auVar75 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar75);
        auVar65._8_4_ = 0x7f800000;
        auVar65._0_8_ = 0x7f8000007f800000;
        auVar65._12_4_ = 0x7f800000;
        auVar65._16_4_ = 0x7f800000;
        auVar65._20_4_ = 0x7f800000;
        auVar65._24_4_ = 0x7f800000;
        auVar65._28_4_ = 0x7f800000;
        local_5900 = vblendvps_avx(auVar65,auVar84,local_58a0);
        auVar84._8_4_ = 0xff800000;
        auVar84._0_8_ = 0xff800000ff800000;
        auVar84._12_4_ = 0xff800000;
        auVar84._16_4_ = 0xff800000;
        auVar84._20_4_ = 0xff800000;
        auVar84._24_4_ = 0xff800000;
        auVar84._28_4_ = 0xff800000;
        auVar96 = ZEXT3264(auVar84);
        local_58e0 = vblendvps_avx(auVar84,auVar75,local_58a0);
        auVar84 = vcmpps_avx(local_58e0,local_58e0,0xf);
        local_5c80._4_4_ = local_58a0._4_4_ ^ auVar84._4_4_;
        local_5c80._0_4_ = local_58a0._0_4_ ^ auVar84._0_4_;
        local_5c80._8_4_ = local_58a0._8_4_ ^ auVar84._8_4_;
        local_5c80._12_4_ = local_58a0._12_4_ ^ auVar84._12_4_;
        local_5c80._16_4_ = local_58a0._16_4_ ^ auVar84._16_4_;
        uStack_5c6c = local_58a0._20_4_ ^ auVar84._20_4_;
        uStack_5c68 = local_58a0._24_4_ ^ auVar84._24_4_;
        uStack_5c64 = local_58a0._28_4_ ^ auVar84._28_4_;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar63 = 7;
        }
        else {
          uVar63 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        pRVar57 = ray + 0x100;
        puVar62 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar60 = (undefined1 (*) [32])local_4640;
        local_4680 = 0x7f800000;
        uStack_467c = 0x7f800000;
        uStack_4678 = 0x7f800000;
        uStack_4674 = 0x7f800000;
        uStack_4670 = 0x7f800000;
        uStack_466c = 0x7f800000;
        uStack_4668 = 0x7f800000;
        uStack_4664 = 0x7f800000;
        local_4660 = local_5900;
        local_5c88 = pRVar57;
LAB_00431e89:
        do {
          do {
            auVar181 = auVar96._0_16_;
            root.ptr = puVar62[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_004329f9;
            puVar62 = puVar62 + -1;
            pauVar60 = pauVar60 + -1;
            local_5c40 = *pauVar60;
            auVar80 = ZEXT3264(local_5c40);
            auVar84 = vcmpps_avx(local_5c40,local_58e0,1);
          } while ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar84 >> 0x7f,0) == '\0') &&
                     (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar84 >> 0xbf,0) == '\0') &&
                   (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar84[0x1f]);
          uVar56 = vmovmskps_avx(auVar84);
          pRVar57 = (RayK<8> *)CONCAT44((int)((ulong)pRVar57 >> 0x20),uVar56);
          local_5c60 = POPCOUNT(uVar56);
          if (uVar63 < local_5c60) {
LAB_00431ec6:
            do {
              auVar181 = auVar96._0_16_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_004329f9;
                local_5880 = local_58e0;
                auVar84 = vcmpps_avx(local_58e0,auVar80._0_32_,6);
                if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar84 >> 0x7f,0) == '\0') &&
                      (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar84 >> 0xbf,0) == '\0') &&
                    (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar84[0x1f]) goto LAB_00431e89;
                uVar55 = (ulong)((uint)root.ptr & 0xf);
                auVar72 = _local_5c80;
                if (uVar55 == 8) goto LAB_00432895;
                auVar87._0_8_ = local_5c80._0_8_ ^ 0xffffffffffffffff;
                auVar87._8_4_ = local_5c80._8_4_ ^ 0xffffffff;
                auVar87._12_4_ = local_5c80._12_4_ ^ 0xffffffff;
                auVar87._16_4_ = local_5c80._16_4_ ^ 0xffffffff;
                auVar87._20_4_ = local_5c80._20_4_ ^ 0xffffffff;
                auVar87._24_4_ = local_5c80._24_4_ ^ 0xffffffff;
                auVar87._28_4_ = local_5c80._28_4_ ^ 0xffffffff;
                uStack_5c18 = *(undefined8 *)(ray + 8);
                uStack_5c10 = *(undefined8 *)(ray + 0x10);
                uStack_5c08 = *(undefined8 *)(ray + 0x18);
                uStack_5c58 = *(undefined8 *)(ray + 0x48);
                uStack_5c50 = *(undefined8 *)(ray + 0x50);
                uStack_5c48 = *(undefined8 *)(ray + 0x58);
                uVar35 = *(undefined8 *)(ray + 0x60);
                uVar36 = *(undefined8 *)(ray + 0x68);
                uVar37 = *(undefined8 *)(ray + 0x70);
                uStack_5ae8 = *(undefined8 *)(ray + 0x78);
                uVar38 = *(undefined8 *)(ray + 0xa0);
                uVar39 = *(undefined8 *)(ray + 0xa8);
                uVar40 = *(undefined8 *)(ray + 0xb0);
                uVar41 = *(undefined8 *)(ray + 0xb8);
                uVar42 = *(undefined8 *)(ray + 0xc0);
                uVar43 = *(undefined8 *)(ray + 200);
                uVar44 = *(undefined8 *)(ray + 0xd0);
                uStack_5aa8 = *(undefined8 *)(ray + 0xd8);
                uVar45 = *(undefined8 *)(ray + 0x80);
                auVar53 = *(undefined1 (*) [12])(ray + 0x80);
                local_5ae0 = (float)uVar45;
                fStack_5adc = (float)((ulong)uVar45 >> 0x20);
                fStack_5ad8 = (float)*(undefined8 *)(ray + 0x88);
                fStack_5ad4 = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
                fStack_5ad0 = (float)*(undefined8 *)(ray + 0x90);
                fStack_5acc = (float)((ulong)*(undefined8 *)(ray + 0x90) >> 0x20);
                fStack_5ac8 = (float)*(undefined8 *)(ray + 0x98);
                uStack_5ac4 = (undefined4)((ulong)*(undefined8 *)(ray + 0x98) >> 0x20);
                uVar45 = *(undefined8 *)(ray + 0x100);
                uVar46 = *(undefined8 *)(ray + 0x108);
                uVar47 = *(undefined8 *)(ray + 0x110);
                uStack_5b08 = *(undefined8 *)(ray + 0x118);
                pRVar1 = ray + 0x120;
                local_5b40 = *(undefined8 *)pRVar1;
                uStack_5b38 = *(undefined8 *)(ray + 0x128);
                uStack_5b30 = *(undefined8 *)(ray + 0x130);
                uStack_5b28 = *(undefined8 *)(ray + 0x138);
                lVar58 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                pRVar57 = (RayK<8> *)0x0;
                local_5ce0 = _local_5c80;
                goto LAB_004321fe;
              }
              pRVar57 = (RayK<8> *)(root.ptr & 0xfffffffffffffff0);
              lVar58 = 0;
              auVar66._8_4_ = 0x7f800000;
              auVar66._0_8_ = 0x7f8000007f800000;
              auVar66._12_4_ = 0x7f800000;
              auVar66._16_4_ = 0x7f800000;
              auVar66._20_4_ = 0x7f800000;
              auVar66._24_4_ = 0x7f800000;
              auVar66._28_4_ = 0x7f800000;
              uVar55 = 8;
              do {
                auVar84 = auVar66;
                uVar59 = *(ulong *)(pRVar57 + lVar58 * 8);
                if (uVar59 == 8) {
                  auVar80 = ZEXT3264(auVar84);
                  break;
                }
                uVar56 = *(undefined4 *)(root.ptr + 0x40 + lVar58 * 4);
                auVar76._4_4_ = uVar56;
                auVar76._0_4_ = uVar56;
                auVar76._8_4_ = uVar56;
                auVar76._12_4_ = uVar56;
                auVar76._16_4_ = uVar56;
                auVar76._20_4_ = uVar56;
                auVar76._24_4_ = uVar56;
                auVar76._28_4_ = uVar56;
                auVar48._8_8_ = local_5a80._8_8_;
                auVar48._0_8_ = local_5a80._0_8_;
                auVar48._16_8_ = local_5a80._16_8_;
                auVar48._24_8_ = local_5a80._24_8_;
                auVar49._8_8_ = local_5a80._40_8_;
                auVar49._0_8_ = local_5a80._32_8_;
                auVar49._16_8_ = local_5a80._48_8_;
                auVar49._24_8_ = local_5a80._56_8_;
                auVar50._8_8_ = local_5a80._72_8_;
                auVar50._0_8_ = local_5a80._64_8_;
                auVar50._16_8_ = local_5a80._80_8_;
                auVar50._24_8_ = local_5a80._88_8_;
                auVar75 = vsubps_avx(auVar76,auVar48);
                auVar74._0_4_ = (float)local_59c0._0_4_ * auVar75._0_4_;
                auVar74._4_4_ = (float)local_59c0._4_4_ * auVar75._4_4_;
                auVar74._8_4_ = fStack_59b8 * auVar75._8_4_;
                auVar74._12_4_ = fStack_59b4 * auVar75._12_4_;
                auVar13._16_4_ = fStack_59b0 * auVar75._16_4_;
                auVar13._0_16_ = auVar74;
                auVar13._20_4_ = fStack_59ac * auVar75._20_4_;
                auVar13._24_4_ = fStack_59a8 * auVar75._24_4_;
                auVar13._28_4_ = auVar75._28_4_;
                uVar56 = *(undefined4 *)(root.ptr + 0x80 + lVar58 * 4);
                auVar85._4_4_ = uVar56;
                auVar85._0_4_ = uVar56;
                auVar85._8_4_ = uVar56;
                auVar85._12_4_ = uVar56;
                auVar85._16_4_ = uVar56;
                auVar85._20_4_ = uVar56;
                auVar85._24_4_ = uVar56;
                auVar85._28_4_ = uVar56;
                auVar75 = vsubps_avx(auVar85,auVar49);
                auVar83._0_4_ = (float)local_59a0._0_4_ * auVar75._0_4_;
                auVar83._4_4_ = (float)local_59a0._4_4_ * auVar75._4_4_;
                auVar83._8_4_ = fStack_5998 * auVar75._8_4_;
                auVar83._12_4_ = fStack_5994 * auVar75._12_4_;
                auVar14._16_4_ = fStack_5990 * auVar75._16_4_;
                auVar14._0_16_ = auVar83;
                auVar14._20_4_ = fStack_598c * auVar75._20_4_;
                auVar14._24_4_ = fStack_5988 * auVar75._24_4_;
                auVar14._28_4_ = auVar75._28_4_;
                uVar56 = *(undefined4 *)(root.ptr + 0xc0 + lVar58 * 4);
                auVar114._4_4_ = uVar56;
                auVar114._0_4_ = uVar56;
                auVar114._8_4_ = uVar56;
                auVar114._12_4_ = uVar56;
                auVar114._16_4_ = uVar56;
                auVar114._20_4_ = uVar56;
                auVar114._24_4_ = uVar56;
                auVar114._28_4_ = uVar56;
                auVar75 = vsubps_avx(auVar114,auVar50);
                auVar110._0_4_ = (float)local_5980._0_4_ * auVar75._0_4_;
                auVar110._4_4_ = (float)local_5980._4_4_ * auVar75._4_4_;
                auVar110._8_4_ = fStack_5978 * auVar75._8_4_;
                auVar110._12_4_ = fStack_5974 * auVar75._12_4_;
                auVar15._16_4_ = fStack_5970 * auVar75._16_4_;
                auVar15._0_16_ = auVar110;
                auVar15._20_4_ = fStack_596c * auVar75._20_4_;
                auVar15._24_4_ = fStack_5968 * auVar75._24_4_;
                auVar15._28_4_ = auVar75._28_4_;
                uVar56 = *(undefined4 *)(root.ptr + 0x60 + lVar58 * 4);
                auVar164._4_4_ = uVar56;
                auVar164._0_4_ = uVar56;
                auVar164._8_4_ = uVar56;
                auVar164._12_4_ = uVar56;
                auVar164._16_4_ = uVar56;
                auVar164._20_4_ = uVar56;
                auVar164._24_4_ = uVar56;
                auVar164._28_4_ = uVar56;
                auVar75 = vsubps_avx(auVar164,auVar48);
                auVar122._0_4_ = (float)local_59c0._0_4_ * auVar75._0_4_;
                auVar122._4_4_ = (float)local_59c0._4_4_ * auVar75._4_4_;
                auVar122._8_4_ = fStack_59b8 * auVar75._8_4_;
                auVar122._12_4_ = fStack_59b4 * auVar75._12_4_;
                auVar16._16_4_ = fStack_59b0 * auVar75._16_4_;
                auVar16._0_16_ = auVar122;
                auVar16._20_4_ = fStack_59ac * auVar75._20_4_;
                auVar16._24_4_ = fStack_59a8 * auVar75._24_4_;
                auVar16._28_4_ = auVar75._28_4_;
                uVar56 = *(undefined4 *)(root.ptr + 0xa0 + lVar58 * 4);
                auVar149._4_4_ = uVar56;
                auVar149._0_4_ = uVar56;
                auVar149._8_4_ = uVar56;
                auVar149._12_4_ = uVar56;
                auVar149._16_4_ = uVar56;
                auVar149._20_4_ = uVar56;
                auVar149._24_4_ = uVar56;
                auVar149._28_4_ = uVar56;
                auVar75 = vsubps_avx(auVar149,auVar49);
                auVar127._0_4_ = (float)local_59a0._0_4_ * auVar75._0_4_;
                auVar127._4_4_ = (float)local_59a0._4_4_ * auVar75._4_4_;
                auVar127._8_4_ = fStack_5998 * auVar75._8_4_;
                auVar127._12_4_ = fStack_5994 * auVar75._12_4_;
                auVar17._16_4_ = fStack_5990 * auVar75._16_4_;
                auVar17._0_16_ = auVar127;
                auVar17._20_4_ = fStack_598c * auVar75._20_4_;
                auVar17._24_4_ = fStack_5988 * auVar75._24_4_;
                auVar17._28_4_ = auVar75._28_4_;
                uVar56 = *(undefined4 *)(root.ptr + 0xe0 + lVar58 * 4);
                auVar150._4_4_ = uVar56;
                auVar150._0_4_ = uVar56;
                auVar150._8_4_ = uVar56;
                auVar150._12_4_ = uVar56;
                auVar150._16_4_ = uVar56;
                auVar150._20_4_ = uVar56;
                auVar150._24_4_ = uVar56;
                auVar150._28_4_ = uVar56;
                auVar75 = vsubps_avx(auVar150,auVar50);
                auVar144._0_4_ = (float)local_5980._0_4_ * auVar75._0_4_;
                auVar144._4_4_ = (float)local_5980._4_4_ * auVar75._4_4_;
                auVar144._8_4_ = fStack_5978 * auVar75._8_4_;
                auVar144._12_4_ = fStack_5974 * auVar75._12_4_;
                auVar18._16_4_ = fStack_5970 * auVar75._16_4_;
                auVar18._0_16_ = auVar144;
                auVar18._20_4_ = fStack_596c * auVar75._20_4_;
                auVar18._24_4_ = fStack_5968 * auVar75._24_4_;
                auVar18._28_4_ = auVar75._28_4_;
                auVar181 = vpminsd_avx(auVar13._16_16_,auVar16._16_16_);
                auVar188 = vpminsd_avx(auVar74,auVar122);
                auVar73 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar181 = vpmaxsd_avx(auVar181,auVar73);
                auVar73 = vpminsd_avx(auVar83,auVar127);
                auVar188 = vpmaxsd_avx(auVar188,auVar73);
                auVar73 = vpminsd_avx(auVar110,auVar144);
                auVar188 = vpmaxsd_avx(auVar188,auVar73);
                auVar120 = auVar15._16_16_;
                in_ZMM15 = ZEXT1664(auVar120);
                auVar73 = vpminsd_avx(auVar120,auVar18._16_16_);
                auVar181 = vpmaxsd_avx(auVar181,auVar73);
                auVar73 = vpmaxsd_avx(auVar188,local_5900._0_16_);
                auVar8 = vpmaxsd_avx(auVar181,local_5900._16_16_);
                auVar9 = vpmaxsd_avx(auVar13._16_16_,auVar16._16_16_);
                auVar74 = vpmaxsd_avx(auVar74,auVar122);
                auVar122 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar122 = vpminsd_avx(auVar9,auVar122);
                auVar9 = vpmaxsd_avx(auVar83,auVar127);
                auVar74 = vpminsd_avx(auVar74,auVar9);
                auVar9 = vpmaxsd_avx(auVar110,auVar144);
                auVar74 = vpminsd_avx(auVar74,auVar9);
                auVar9 = vpmaxsd_avx(auVar120,auVar18._16_16_);
                auVar9 = vpminsd_avx(auVar122,auVar9);
                auVar74 = vpminsd_avx(auVar74,local_58e0._0_16_);
                auVar9 = vpminsd_avx(auVar9,local_58e0._16_16_);
                auVar96 = ZEXT1664(auVar9);
                auVar67._16_16_ = auVar8;
                auVar67._0_16_ = auVar73;
                auVar77._16_16_ = auVar9;
                auVar77._0_16_ = auVar74;
                auVar75 = vcmpps_avx(auVar67,auVar77,2);
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar75 >> 0x7f,0) == '\0') &&
                      (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar75 >> 0xbf,0) == '\0') &&
                    (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar75[0x1f]) {
                  auVar80 = ZEXT3264(auVar84);
                  uVar59 = uVar55;
                }
                else {
                  auVar68._16_16_ = auVar181;
                  auVar68._0_16_ = auVar188;
                  auVar111 = vblendps_avx(auVar68,auVar68,0xf0);
                  auVar86._8_4_ = 0x7f800000;
                  auVar86._0_8_ = 0x7f8000007f800000;
                  auVar86._12_4_ = 0x7f800000;
                  auVar86._16_4_ = 0x7f800000;
                  auVar86._20_4_ = 0x7f800000;
                  auVar86._24_4_ = 0x7f800000;
                  auVar86._28_4_ = 0x7f800000;
                  auVar96 = ZEXT3264(auVar86);
                  auVar75 = vblendvps_avx(auVar86,auVar111,auVar75);
                  auVar80 = ZEXT3264(auVar75);
                  if (uVar55 != 8) {
                    *puVar62 = uVar55;
                    puVar62 = puVar62 + 1;
                    local_5d00._0_8_ = auVar84._0_8_;
                    local_5d00._8_8_ = auVar84._8_8_;
                    uStack_5cf0 = auVar84._16_8_;
                    uStack_5ce8 = auVar84._24_8_;
                    *(undefined8 *)*pauVar60 = local_5d00._0_8_;
                    *(undefined8 *)(*pauVar60 + 8) = local_5d00._8_8_;
                    *(undefined8 *)(*pauVar60 + 0x10) = uStack_5cf0;
                    *(undefined8 *)(*pauVar60 + 0x18) = uStack_5ce8;
                    pauVar60 = pauVar60 + 1;
                  }
                }
                uVar55 = uVar59;
                lVar58 = lVar58 + 1;
                auVar66 = auVar80._0_32_;
                _local_5d00 = auVar84;
              } while (lVar58 != 8);
              if (uVar55 == 8) goto LAB_004320f4;
              auVar84 = vcmpps_avx(local_58e0,auVar80._0_32_,6);
              uVar56 = vmovmskps_avx(auVar84);
              root.ptr = uVar55;
            } while ((byte)uVar63 < (byte)POPCOUNT(uVar56));
            *puVar62 = uVar55;
            puVar62 = puVar62 + 1;
            *pauVar60 = auVar80._0_32_;
            pauVar60 = pauVar60 + 1;
LAB_004320f4:
            iVar54 = 4;
            pRVar1 = pRVar57;
          }
          else {
            uStack_5c5c = 0;
            while (pRVar57 != (RayK<8> *)0x0) {
              local_5d00._0_8_ = pRVar57;
              local_5c20 = 0;
              if (pRVar57 != (RayK<8> *)0x0) {
                for (; ((ulong)pRVar57 >> local_5c20 & 1) == 0; local_5c20 = local_5c20 + 1) {
                }
              }
              auVar96 = ZEXT1664(auVar96._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              local_5d08 = This;
              local_5c98 = ray;
              local_5c90 = context;
              bVar64 = occluded1(This,local_5d10,root,local_5c20,&local_5d11,ray,
                                 (TravRayK<8,_false> *)&local_5a80.field_0,context);
              auVar181 = auVar96._0_16_;
              if (bVar64) {
                *(undefined4 *)(local_5c80 + local_5c20 * 4) = 0xffffffff;
              }
              This = local_5d08;
              ray = local_5c98;
              context = local_5c90;
              pRVar57 = (RayK<8> *)(local_5d00._0_8_ & local_5d00._0_8_ - 1);
            }
            auVar181 = vpcmpeqd_avx(auVar181,auVar181);
            auVar188 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar181);
            auVar181 = vpcmpgtd_avx(local_5c80._0_16_,auVar181);
            auVar96 = ZEXT1664(auVar181);
            auVar181 = vpor_avx(auVar181,auVar188);
            iVar54 = 3;
            if ((((auVar181 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar181 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar181 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar181[0xf] < '\0') {
              auVar95._8_4_ = 0xff800000;
              auVar95._0_8_ = 0xff800000ff800000;
              auVar95._12_4_ = 0xff800000;
              auVar95._16_4_ = 0xff800000;
              auVar95._20_4_ = 0xff800000;
              auVar95._24_4_ = 0xff800000;
              auVar95._28_4_ = 0xff800000;
              auVar96 = ZEXT3264(auVar95);
              local_58e0 = vblendvps_avx(local_58e0,auVar95,_local_5c80);
              iVar54 = 2;
            }
            auVar80 = ZEXT3264(local_5c40);
            pRVar57 = (RayK<8> *)0x0;
            pRVar1 = (RayK<8> *)0x0;
            if (uVar63 < local_5c60) goto LAB_00431ec6;
          }
          pRVar57 = pRVar1;
        } while (iVar54 != 3);
LAB_004329f9:
        auVar84 = vandps_avx(local_58a0,_local_5c80);
        auVar79._8_4_ = 0xff800000;
        auVar79._0_8_ = 0xff800000ff800000;
        auVar79._12_4_ = 0xff800000;
        auVar79._16_4_ = 0xff800000;
        auVar79._20_4_ = 0xff800000;
        auVar79._24_4_ = 0xff800000;
        auVar79._28_4_ = 0xff800000;
        auVar84 = vmaskmovps_avx(auVar84,auVar79);
        *(undefined1 (*) [32])local_5c88 = auVar84;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    pRVar57 = pRVar57 + 1;
    lVar58 = lVar58 + 0xe0;
    auVar181 = auVar87._0_16_;
    if ((RayK<8> *)(uVar55 - 8) <= pRVar57) break;
LAB_004321fe:
    local_5cc0 = auVar87;
    uVar59 = 0;
    auVar84 = local_5cc0;
    while (uVar61 = (ulong)*(uint *)(lVar58 + uVar59 * 4), auVar75 = auVar84, auVar111 = _local_5d00
          , uVar61 != 0xffffffff) {
      fVar2 = *(float *)(lVar58 + -0xc0 + uVar59 * 4);
      auVar124._4_4_ = fVar2;
      auVar124._0_4_ = fVar2;
      auVar124._8_4_ = fVar2;
      auVar124._12_4_ = fVar2;
      auVar124._16_4_ = fVar2;
      auVar124._20_4_ = fVar2;
      auVar124._24_4_ = fVar2;
      auVar124._28_4_ = fVar2;
      fVar3 = *(float *)(lVar58 + -0xb0 + uVar59 * 4);
      auVar88._4_4_ = fVar3;
      auVar88._0_4_ = fVar3;
      auVar88._8_4_ = fVar3;
      auVar88._12_4_ = fVar3;
      auVar88._16_4_ = fVar3;
      auVar88._20_4_ = fVar3;
      auVar88._24_4_ = fVar3;
      auVar88._28_4_ = fVar3;
      fVar4 = *(float *)(lVar58 + -0xa0 + uVar59 * 4);
      auVar115._4_4_ = fVar4;
      auVar115._0_4_ = fVar4;
      auVar115._8_4_ = fVar4;
      auVar115._12_4_ = fVar4;
      auVar115._16_4_ = fVar4;
      auVar115._20_4_ = fVar4;
      auVar115._24_4_ = fVar4;
      auVar115._28_4_ = fVar4;
      local_5ba0._4_4_ = *(float *)(lVar58 + -0x90 + uVar59 * 4);
      local_5bc0._4_4_ = *(float *)(lVar58 + -0x80 + uVar59 * 4);
      local_5be0._4_4_ = *(float *)(lVar58 + -0x70 + uVar59 * 4);
      local_5c00._4_4_ = *(float *)(lVar58 + -0x30 + uVar59 * 4);
      local_5840 = *(float *)(lVar58 + -0x20 + uVar59 * 4);
      local_5860 = *(float *)(lVar58 + -0x10 + uVar59 * 4);
      local_5ba0._0_4_ = local_5ba0._4_4_;
      fStack_5b98 = (float)local_5ba0._4_4_;
      fStack_5b94 = (float)local_5ba0._4_4_;
      fStack_5b90 = (float)local_5ba0._4_4_;
      fStack_5b8c = (float)local_5ba0._4_4_;
      fStack_5b88 = (float)local_5ba0._4_4_;
      fStack_5b84 = (float)local_5ba0._4_4_;
      fVar183 = fVar2 - (float)local_5ba0._4_4_;
      local_5bc0._0_4_ = local_5bc0._4_4_;
      fStack_5bb8 = (float)local_5bc0._4_4_;
      fStack_5bb4 = (float)local_5bc0._4_4_;
      fStack_5bb0 = (float)local_5bc0._4_4_;
      fStack_5bac = (float)local_5bc0._4_4_;
      fStack_5ba8 = (float)local_5bc0._4_4_;
      fStack_5ba4 = (float)local_5bc0._4_4_;
      fVar190 = fVar3 - (float)local_5bc0._4_4_;
      local_5be0._0_4_ = local_5be0._4_4_;
      fStack_5bd8 = (float)local_5be0._4_4_;
      fStack_5bd4 = (float)local_5be0._4_4_;
      fStack_5bd0 = (float)local_5be0._4_4_;
      fStack_5bcc = (float)local_5be0._4_4_;
      fStack_5bc8 = (float)local_5be0._4_4_;
      fStack_5bc4 = (float)local_5be0._4_4_;
      fVar192 = fVar4 - (float)local_5be0._4_4_;
      fVar3 = local_5840 - fVar3;
      fVar4 = local_5860 - fVar4;
      local_5c00._0_4_ = local_5c00._4_4_;
      fStack_5bf8 = (float)local_5c00._4_4_;
      fStack_5bf4 = (float)local_5c00._4_4_;
      fStack_5bf0 = (float)local_5c00._4_4_;
      fStack_5bec = (float)local_5c00._4_4_;
      fStack_5be8 = (float)local_5c00._4_4_;
      fStack_5be4 = (float)local_5c00._4_4_;
      fVar2 = (float)local_5c00._4_4_ - fVar2;
      local_5b50 = ZEXT416((uint)fVar192);
      local_5b70 = ZEXT416((uint)fVar183);
      local_5b60 = ZEXT416((uint)fVar190);
      auVar111 = vsubps_avx(auVar88,*(undefined1 (*) [32])(ray + 0x20));
      auVar10 = vsubps_avx(auVar115,*(undefined1 (*) [32])(ray + 0x40));
      local_5aa0._0_4_ = (float)uVar38;
      local_5aa0._4_4_ = (float)((ulong)uVar38 >> 0x20);
      uStack_5a98._0_4_ = (float)uVar39;
      uStack_5a98._4_4_ = (float)((ulong)uVar39 >> 0x20);
      uStack_5a90._0_4_ = (float)uVar40;
      uStack_5a90._4_4_ = (float)((ulong)uVar40 >> 0x20);
      uStack_5a88._0_4_ = (float)uVar41;
      fVar109 = auVar10._0_4_;
      auVar151._0_4_ = fVar109 * (float)local_5aa0;
      fVar116 = auVar10._4_4_;
      auVar151._4_4_ = fVar116 * local_5aa0._4_4_;
      fVar117 = auVar10._8_4_;
      auVar151._8_4_ = fVar117 * (float)uStack_5a98;
      fVar118 = auVar10._12_4_;
      auVar151._12_4_ = fVar118 * uStack_5a98._4_4_;
      fVar119 = auVar10._16_4_;
      auVar151._16_4_ = fVar119 * (float)uStack_5a90;
      fVar121 = auVar10._20_4_;
      auVar151._20_4_ = fVar121 * uStack_5a90._4_4_;
      fVar82 = auVar10._24_4_;
      auVar151._24_4_ = fVar82 * (float)uStack_5a88;
      auVar151._28_4_ = 0;
      local_5ac0._0_4_ = (float)uVar42;
      local_5ac0._4_4_ = (float)((ulong)uVar42 >> 0x20);
      uStack_5ab8._0_4_ = (float)uVar43;
      uStack_5ab8._4_4_ = (float)((ulong)uVar43 >> 0x20);
      uStack_5ab0._0_4_ = (float)uVar44;
      uStack_5ab0._4_4_ = (float)((ulong)uVar44 >> 0x20);
      fVar81 = auVar111._0_4_;
      auVar156._0_4_ = fVar81 * (float)local_5ac0;
      fVar97 = auVar111._4_4_;
      auVar156._4_4_ = fVar97 * local_5ac0._4_4_;
      fVar99 = auVar111._8_4_;
      auVar156._8_4_ = fVar99 * (float)uStack_5ab8;
      fVar101 = auVar111._12_4_;
      auVar156._12_4_ = fVar101 * uStack_5ab8._4_4_;
      fVar103 = auVar111._16_4_;
      auVar156._16_4_ = fVar103 * (float)uStack_5ab0;
      fVar105 = auVar111._20_4_;
      auVar156._20_4_ = fVar105 * uStack_5ab0._4_4_;
      fVar107 = auVar111._24_4_;
      auVar156._24_4_ = fVar107 * (float)uStack_5aa8;
      auVar156._28_4_ = 0;
      auVar11 = vsubps_avx(auVar156,auVar151);
      auVar75 = vsubps_avx(auVar124,*(undefined1 (*) [32])ray);
      fVar98 = auVar75._0_4_;
      fVar100 = auVar75._4_4_;
      auVar19._4_4_ = fVar100 * local_5ac0._4_4_;
      auVar19._0_4_ = fVar98 * (float)local_5ac0;
      fVar102 = auVar75._8_4_;
      auVar19._8_4_ = fVar102 * (float)uStack_5ab8;
      fVar104 = auVar75._12_4_;
      auVar19._12_4_ = fVar104 * uStack_5ab8._4_4_;
      fVar106 = auVar75._16_4_;
      auVar19._16_4_ = fVar106 * (float)uStack_5ab0;
      fVar108 = auVar75._20_4_;
      auVar19._20_4_ = fVar108 * uStack_5ab0._4_4_;
      fVar125 = auVar75._24_4_;
      auVar19._24_4_ = fVar125 * (float)uStack_5aa8;
      auVar19._28_4_ = 0;
      fVar5 = auVar53._0_4_;
      auVar165._0_4_ = fVar109 * fVar5;
      fVar6 = auVar53._4_4_;
      auVar165._4_4_ = fVar116 * fVar6;
      fVar7 = auVar53._8_4_;
      auVar165._8_4_ = fVar117 * fVar7;
      auVar165._12_4_ = fVar118 * fStack_5ad4;
      auVar165._16_4_ = fVar119 * fStack_5ad0;
      auVar165._20_4_ = fVar121 * fStack_5acc;
      auVar165._24_4_ = fVar82 * fStack_5ac8;
      auVar165._28_4_ = 0;
      auVar12 = vsubps_avx(auVar165,auVar19);
      auVar20._4_4_ = fVar97 * fVar6;
      auVar20._0_4_ = fVar81 * fVar5;
      auVar20._8_4_ = fVar99 * fVar7;
      auVar20._12_4_ = fVar101 * fStack_5ad4;
      auVar20._16_4_ = fVar103 * fStack_5ad0;
      auVar20._20_4_ = fVar105 * fStack_5acc;
      auVar20._24_4_ = fVar107 * fStack_5ac8;
      auVar20._28_4_ = 0;
      auVar96._0_4_ = fVar98 * (float)local_5aa0;
      auVar96._4_4_ = fVar100 * local_5aa0._4_4_;
      auVar96._8_4_ = fVar102 * (float)uStack_5a98;
      auVar96._12_4_ = fVar104 * uStack_5a98._4_4_;
      auVar96._16_4_ = fVar106 * (float)uStack_5a90;
      auVar96._20_4_ = fVar108 * uStack_5a90._4_4_;
      auVar96._28_36_ = in_ZMM15._28_36_;
      auVar96._24_4_ = fVar125 * (float)uStack_5a88;
      auVar65 = vsubps_avx(auVar96._0_32_,auVar20);
      auVar181 = ZEXT416((uint)(fVar183 * fVar4 - fVar192 * fVar2));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      auVar184._16_16_ = auVar181;
      auVar184._0_16_ = auVar181;
      auVar188 = ZEXT416((uint)(fVar190 * fVar2 - fVar183 * fVar3));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      fVar140 = auVar188._0_4_;
      fVar142 = auVar188._4_4_;
      fVar155 = auVar188._8_4_;
      fVar189 = auVar188._12_4_;
      fVar183 = auVar181._0_4_;
      fVar133 = auVar181._4_4_;
      fVar135 = auVar181._8_4_;
      fVar137 = auVar181._12_4_;
      auVar96 = ZEXT3264(auVar84);
      fVar186 = fVar137 + in_ZMM15._28_4_;
      auVar187 = ZEXT436((uint)fVar186);
      auVar181 = ZEXT416((uint)(fVar192 * fVar3 - fVar190 * fVar4));
      auVar181 = vshufps_avx(auVar181,auVar181,0);
      in_ZMM15 = ZEXT3264(CONCAT1616(auVar181,auVar181));
      fVar190 = auVar181._0_4_;
      fVar192 = auVar181._4_4_;
      fVar157 = auVar181._8_4_;
      auVar182._0_4_ = fVar190 * fVar5 + fVar183 * (float)local_5aa0 + fVar140 * (float)local_5ac0;
      auVar182._4_4_ = fVar192 * fVar6 + fVar133 * local_5aa0._4_4_ + fVar142 * local_5ac0._4_4_;
      auVar182._8_4_ = fVar157 * fVar7 + fVar135 * (float)uStack_5a98 + fVar155 * (float)uStack_5ab8
      ;
      auVar182._12_4_ =
           auVar181._12_4_ * fStack_5ad4 + fVar137 * uStack_5a98._4_4_ + fVar189 * uStack_5ab8._4_4_
      ;
      auVar182._16_4_ =
           fVar190 * fStack_5ad0 + fVar183 * (float)uStack_5a90 + fVar140 * (float)uStack_5ab0;
      auVar182._20_4_ =
           fVar192 * fStack_5acc + fVar133 * uStack_5a90._4_4_ + fVar142 * uStack_5ab0._4_4_;
      auVar182._24_4_ =
           fVar157 * fStack_5ac8 + fVar135 * (float)uStack_5a88 + fVar155 * (float)uStack_5aa8;
      auVar182._28_4_ = fVar186 + 0.0;
      auVar188 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar73 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar8 = vshufps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0);
      auVar130._8_4_ = 0x80000000;
      auVar130._0_8_ = 0x8000000080000000;
      auVar130._12_4_ = 0x80000000;
      auVar130._16_4_ = 0x80000000;
      auVar130._20_4_ = 0x80000000;
      auVar130._24_4_ = 0x80000000;
      auVar130._28_4_ = 0x80000000;
      auVar75 = vandps_avx(auVar182,auVar130);
      uVar126 = auVar75._0_4_;
      auVar146._0_4_ =
           uVar126 ^ (uint)(auVar11._0_4_ * auVar8._0_4_ +
                           auVar73._0_4_ * auVar65._0_4_ + auVar12._0_4_ * auVar188._0_4_);
      uVar132 = auVar75._4_4_;
      auVar146._4_4_ =
           uVar132 ^ (uint)(auVar11._4_4_ * auVar8._4_4_ +
                           auVar73._4_4_ * auVar65._4_4_ + auVar12._4_4_ * auVar188._4_4_);
      uVar134 = auVar75._8_4_;
      auVar146._8_4_ =
           uVar134 ^ (uint)(auVar11._8_4_ * auVar8._8_4_ +
                           auVar73._8_4_ * auVar65._8_4_ + auVar12._8_4_ * auVar188._8_4_);
      uVar136 = auVar75._12_4_;
      auVar146._12_4_ =
           uVar136 ^ (uint)(auVar11._12_4_ * auVar8._12_4_ +
                           auVar73._12_4_ * auVar65._12_4_ + auVar12._12_4_ * auVar188._12_4_);
      uVar138 = auVar75._16_4_;
      auVar146._16_4_ =
           uVar138 ^ (uint)(auVar11._16_4_ * auVar8._0_4_ +
                           auVar73._0_4_ * auVar65._16_4_ + auVar12._16_4_ * auVar188._0_4_);
      uVar139 = auVar75._20_4_;
      auVar146._20_4_ =
           uVar139 ^ (uint)(auVar11._20_4_ * auVar8._4_4_ +
                           auVar73._4_4_ * auVar65._20_4_ + auVar12._20_4_ * auVar188._4_4_);
      uVar141 = auVar75._24_4_;
      auVar146._24_4_ =
           uVar141 ^ (uint)(auVar11._24_4_ * auVar8._8_4_ +
                           auVar73._8_4_ * auVar65._24_4_ + auVar12._24_4_ * auVar188._8_4_);
      uVar143 = auVar75._28_4_;
      auVar146._28_4_ = uVar143 ^ (uint)(auVar8._12_4_ + auVar73._12_4_ + auVar188._12_4_);
      auVar75 = vcmpps_avx(auVar146,_DAT_01faff00,5);
      auVar112 = auVar84 & auVar75;
      local_5b00._0_4_ = (float)uVar35;
      local_5b00._4_4_ = (float)((ulong)uVar35 >> 0x20);
      uStack_5af8._0_4_ = (float)uVar36;
      uStack_5af8._4_4_ = (float)((ulong)uVar36 >> 0x20);
      uStack_5af0._0_4_ = (float)uVar37;
      uStack_5af0._4_4_ = (float)((ulong)uVar37 >> 0x20);
      local_5b20._0_4_ = (float)uVar45;
      local_5b20._4_4_ = (float)((ulong)uVar45 >> 0x20);
      uStack_5b18._0_4_ = (float)uVar46;
      uStack_5b18._4_4_ = (float)((ulong)uVar46 >> 0x20);
      uStack_5b10._0_4_ = (float)uVar47;
      uStack_5b10._4_4_ = (float)((ulong)uVar47 >> 0x20);
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0x7f,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar112 >> 0xbf,0) != '\0') ||
          (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar112[0x1f] < '\0') {
        auVar188 = vpermilps_avx(local_5b70,0);
        auVar73 = vpermilps_avx(local_5b60,0);
        auVar187 = ZEXT436((uint)auVar73._12_4_);
        auVar8 = vpermilps_avx(local_5b50,0);
        auVar112 = vandps_avx(auVar75,auVar84);
        auVar152._0_4_ =
             uVar126 ^ (uint)(auVar188._0_4_ * auVar11._0_4_ +
                             auVar73._0_4_ * auVar12._0_4_ + auVar65._0_4_ * auVar8._0_4_);
        auVar152._4_4_ =
             uVar132 ^ (uint)(auVar188._4_4_ * auVar11._4_4_ +
                             auVar73._4_4_ * auVar12._4_4_ + auVar65._4_4_ * auVar8._4_4_);
        auVar152._8_4_ =
             uVar134 ^ (uint)(auVar188._8_4_ * auVar11._8_4_ +
                             auVar73._8_4_ * auVar12._8_4_ + auVar65._8_4_ * auVar8._8_4_);
        auVar152._12_4_ =
             uVar136 ^ (uint)(auVar188._12_4_ * auVar11._12_4_ +
                             auVar73._12_4_ * auVar12._12_4_ + auVar65._12_4_ * auVar8._12_4_);
        auVar152._16_4_ =
             uVar138 ^ (uint)(auVar188._0_4_ * auVar11._16_4_ +
                             auVar73._0_4_ * auVar12._16_4_ + auVar65._16_4_ * auVar8._0_4_);
        auVar152._20_4_ =
             uVar139 ^ (uint)(auVar188._4_4_ * auVar11._20_4_ +
                             auVar73._4_4_ * auVar12._20_4_ + auVar65._20_4_ * auVar8._4_4_);
        auVar152._24_4_ =
             uVar141 ^ (uint)(auVar188._8_4_ * auVar11._24_4_ +
                             auVar73._8_4_ * auVar12._24_4_ + auVar65._24_4_ * auVar8._8_4_);
        auVar152._28_4_ = uVar143 ^ (uint)(auVar11._28_4_ + auVar75._28_4_ + auVar8._12_4_);
        auVar75 = vcmpps_avx(auVar152,_DAT_01faff00,5);
        auVar11 = auVar112 & auVar75;
        local_58c0 = auVar184;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar69._8_4_ = 0x7fffffff;
          auVar69._0_8_ = 0x7fffffff7fffffff;
          auVar69._12_4_ = 0x7fffffff;
          auVar69._16_4_ = 0x7fffffff;
          auVar69._20_4_ = 0x7fffffff;
          auVar69._24_4_ = 0x7fffffff;
          auVar69._28_4_ = 0x7fffffff;
          auVar11 = vandps_avx(auVar182,auVar69);
          auVar75 = vandps_avx(auVar75,auVar112);
          auVar12 = vsubps_avx(auVar11,auVar146);
          auVar12 = vcmpps_avx(auVar12,auVar152,5);
          auVar65 = auVar75 & auVar12;
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0x7f,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0xbf,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar65[0x1f] < '\0') {
            auVar75 = vandps_avx(auVar12,auVar75);
            fVar2 = auVar10._28_4_;
            auVar90._0_4_ =
                 uVar126 ^ (uint)(fVar190 * fVar98 + fVar140 * fVar109 + fVar81 * fVar183);
            auVar90._4_4_ =
                 uVar132 ^ (uint)(fVar192 * fVar100 + fVar142 * fVar116 + fVar97 * fVar133);
            auVar90._8_4_ =
                 uVar134 ^ (uint)(fVar157 * fVar102 + fVar155 * fVar117 + fVar99 * fVar135);
            auVar90._12_4_ =
                 uVar136 ^ (uint)(auVar181._12_4_ * fVar104 + fVar189 * fVar118 + fVar101 * fVar137)
            ;
            auVar90._16_4_ =
                 uVar138 ^ (uint)(fVar190 * fVar106 + fVar140 * fVar119 + fVar103 * fVar183);
            auVar90._20_4_ =
                 uVar139 ^ (uint)(fVar192 * fVar108 + fVar142 * fVar121 + fVar105 * fVar133);
            auVar90._24_4_ =
                 uVar141 ^ (uint)(fVar157 * fVar125 + fVar155 * fVar82 + fVar107 * fVar135);
            auVar90._28_4_ = uVar143 ^ (uint)(fVar2 + fVar2 + auVar111._28_4_);
            auVar31._4_4_ = auVar11._4_4_ * local_5b00._4_4_;
            auVar31._0_4_ = auVar11._0_4_ * (float)local_5b00;
            auVar31._8_4_ = auVar11._8_4_ * (float)uStack_5af8;
            auVar31._12_4_ = auVar11._12_4_ * uStack_5af8._4_4_;
            auVar31._16_4_ = auVar11._16_4_ * (float)uStack_5af0;
            auVar31._20_4_ = auVar11._20_4_ * uStack_5af0._4_4_;
            auVar31._24_4_ = auVar11._24_4_ * (float)uStack_5ae8;
            auVar31._28_4_ = fVar2;
            auVar111 = vcmpps_avx(auVar31,auVar90,1);
            auVar32._4_4_ = auVar11._4_4_ * local_5b20._4_4_;
            auVar32._0_4_ = auVar11._0_4_ * (float)local_5b20;
            auVar32._8_4_ = auVar11._8_4_ * (float)uStack_5b18;
            auVar32._12_4_ = auVar11._12_4_ * uStack_5b18._4_4_;
            auVar32._16_4_ = auVar11._16_4_ * (float)uStack_5b10;
            auVar32._20_4_ = auVar11._20_4_ * uStack_5b10._4_4_;
            auVar32._24_4_ = auVar11._24_4_ * (float)uStack_5b08;
            auVar32._28_4_ = auVar11._28_4_;
            auVar10 = vcmpps_avx(auVar90,auVar32,2);
            auVar111 = vandps_avx(auVar10,auVar111);
            auVar10 = auVar75 & auVar111;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar75 = vandps_avx(auVar111,auVar75);
              auVar111 = vcmpps_avx(auVar182,_DAT_01faff00,4);
              auVar10 = auVar75 & auVar111;
              if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar10[0x1f] < '\0') {
                uVar126 = ((context->scene->geometries).items[uVar61].ptr)->mask;
                auVar91._4_4_ = uVar126;
                auVar91._0_4_ = uVar126;
                auVar91._8_4_ = uVar126;
                auVar91._12_4_ = uVar126;
                auVar91._16_4_ = uVar126;
                auVar91._20_4_ = uVar126;
                auVar91._24_4_ = uVar126;
                auVar91._28_4_ = uVar126;
                auVar75 = vandps_avx(auVar111,auVar75);
                auVar111 = vandps_avx(auVar91,*(undefined1 (*) [32])pRVar1);
                auVar181 = vpcmpeqd_avx(auVar111._16_16_,ZEXT816(0) << 0x20);
                auVar188 = vpcmpeqd_avx(auVar111._0_16_,ZEXT816(0) << 0x20);
                auVar92._16_16_ = auVar181;
                auVar92._0_16_ = auVar75._0_16_;
                auVar111 = vblendps_avx(ZEXT1632(auVar188),auVar92,0xf0);
                auVar10 = auVar75 & ~auVar111;
                if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0x7f,0) != '\0') ||
                      (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar10[0x1f] < '\0') {
                  auVar75 = vandnps_avx(auVar111,auVar75);
                  auVar75 = vandnps_avx(auVar75,auVar84);
                  auVar96 = ZEXT3264(auVar75);
                  goto LAB_004323f9;
                }
              }
            }
          }
        }
        auVar96 = ZEXT3264(auVar84);
      }
LAB_004323f9:
      _local_5d00 = auVar96._0_32_;
      auVar75 = _local_5d00;
      auVar111 = auVar84;
      fStack_585c = local_5860;
      fStack_5858 = local_5860;
      fStack_5854 = local_5860;
      fStack_5850 = local_5860;
      fStack_584c = local_5860;
      fStack_5848 = local_5860;
      fStack_5844 = local_5860;
      fStack_583c = local_5840;
      fStack_5838 = local_5840;
      fStack_5834 = local_5840;
      fStack_5830 = local_5840;
      fStack_582c = local_5840;
      fStack_5828 = local_5840;
      fStack_5824 = local_5840;
      if ((((((((_local_5d00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (_local_5d00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (_local_5d00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(_local_5d00 >> 0x7f,0) == '\0') &&
            (auVar96 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(_local_5d00 >> 0xbf,0) == '\0') &&
          (auVar96 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) && -1 < auVar96[0x1f])
      break;
      uVar56 = *(undefined4 *)(lVar58 + -0x60 + uVar59 * 4);
      auVar89._4_4_ = uVar56;
      auVar89._0_4_ = uVar56;
      auVar89._8_4_ = uVar56;
      auVar89._12_4_ = uVar56;
      auVar89._16_4_ = uVar56;
      auVar89._20_4_ = uVar56;
      auVar89._24_4_ = uVar56;
      auVar89._28_4_ = uVar56;
      uVar56 = *(undefined4 *)(lVar58 + -0x50 + uVar59 * 4);
      auVar131._4_4_ = uVar56;
      auVar131._0_4_ = uVar56;
      auVar131._8_4_ = uVar56;
      auVar131._12_4_ = uVar56;
      auVar131._16_4_ = uVar56;
      auVar131._20_4_ = uVar56;
      auVar131._24_4_ = uVar56;
      auVar131._28_4_ = uVar56;
      fVar2 = *(float *)(lVar58 + -0x40 + uVar59 * 4);
      auVar147._4_4_ = fVar2;
      auVar147._0_4_ = fVar2;
      auVar147._8_4_ = fVar2;
      auVar147._12_4_ = fVar2;
      auVar147._16_4_ = fVar2;
      auVar147._20_4_ = fVar2;
      auVar147._24_4_ = fVar2;
      auVar147._28_4_ = fVar2;
      auVar10 = vsubps_avx(auVar89,_local_5c00);
      auVar52._4_4_ = local_5840;
      auVar52._0_4_ = local_5840;
      auVar52._8_4_ = local_5840;
      auVar52._12_4_ = local_5840;
      auVar52._16_4_ = local_5840;
      auVar52._20_4_ = local_5840;
      auVar52._24_4_ = local_5840;
      auVar52._28_4_ = local_5840;
      auVar11 = vsubps_avx(auVar131,auVar52);
      auVar51._4_4_ = local_5860;
      auVar51._0_4_ = local_5860;
      auVar51._8_4_ = local_5860;
      auVar51._12_4_ = local_5860;
      auVar51._16_4_ = local_5860;
      auVar51._20_4_ = local_5860;
      auVar51._24_4_ = local_5860;
      auVar51._28_4_ = local_5860;
      auVar12 = vsubps_avx(auVar147,auVar51);
      auVar111 = vsubps_avx(_local_5ba0,auVar89);
      auVar65 = vsubps_avx(_local_5bc0,auVar131);
      auVar84 = vsubps_avx(_local_5be0,auVar147);
      fVar3 = auVar11._0_4_;
      fVar191 = auVar84._0_4_;
      auVar80._0_4_ = fVar191 * fVar3;
      fVar6 = auVar11._4_4_;
      fVar193 = auVar84._4_4_;
      auVar80._4_4_ = fVar193 * fVar6;
      fVar190 = auVar11._8_4_;
      fVar194 = auVar84._8_4_;
      auVar80._8_4_ = fVar194 * fVar190;
      fVar97 = auVar11._12_4_;
      fVar195 = auVar84._12_4_;
      auVar80._12_4_ = fVar195 * fVar97;
      fVar103 = auVar11._16_4_;
      fVar196 = auVar84._16_4_;
      auVar80._16_4_ = fVar196 * fVar103;
      fVar109 = auVar11._20_4_;
      fVar197 = auVar84._20_4_;
      auVar80._20_4_ = fVar197 * fVar109;
      fVar118 = auVar11._24_4_;
      auVar80._28_36_ = auVar96._28_36_;
      fVar198 = auVar84._24_4_;
      auVar80._24_4_ = fVar198 * fVar118;
      fVar4 = auVar12._0_4_;
      fVar173 = auVar65._0_4_;
      fVar7 = auVar12._4_4_;
      fVar175 = auVar65._4_4_;
      auVar21._4_4_ = fVar175 * fVar7;
      auVar21._0_4_ = fVar173 * fVar4;
      fVar192 = auVar12._8_4_;
      fVar176 = auVar65._8_4_;
      auVar21._8_4_ = fVar176 * fVar192;
      fVar99 = auVar12._12_4_;
      fVar177 = auVar65._12_4_;
      auVar21._12_4_ = fVar177 * fVar99;
      fVar105 = auVar12._16_4_;
      fVar178 = auVar65._16_4_;
      auVar21._16_4_ = fVar178 * fVar105;
      fVar116 = auVar12._20_4_;
      fVar179 = auVar65._20_4_;
      auVar21._20_4_ = fVar179 * fVar116;
      fVar119 = auVar12._24_4_;
      fVar180 = auVar65._24_4_;
      auVar21._24_4_ = fVar180 * fVar119;
      auVar21._28_4_ = local_5be0._4_4_;
      auVar112 = vsubps_avx(auVar21,auVar80._0_32_);
      fVar163 = auVar111._0_4_;
      fVar167 = auVar111._4_4_;
      auVar22._4_4_ = fVar167 * fVar7;
      auVar22._0_4_ = fVar163 * fVar4;
      fVar168 = auVar111._8_4_;
      auVar22._8_4_ = fVar168 * fVar192;
      fVar169 = auVar111._12_4_;
      auVar22._12_4_ = fVar169 * fVar99;
      fVar170 = auVar111._16_4_;
      auVar22._16_4_ = fVar170 * fVar105;
      fVar171 = auVar111._20_4_;
      auVar22._20_4_ = fVar171 * fVar116;
      fVar172 = auVar111._24_4_;
      auVar22._24_4_ = fVar172 * fVar119;
      auVar22._28_4_ = local_5be0._4_4_;
      fVar5 = auVar10._0_4_;
      fVar183 = auVar10._4_4_;
      auVar23._4_4_ = fVar193 * fVar183;
      auVar23._0_4_ = fVar191 * fVar5;
      fVar81 = auVar10._8_4_;
      auVar23._8_4_ = fVar194 * fVar81;
      fVar101 = auVar10._12_4_;
      auVar23._12_4_ = fVar195 * fVar101;
      fVar107 = auVar10._16_4_;
      auVar23._16_4_ = fVar196 * fVar107;
      fVar117 = auVar10._20_4_;
      auVar23._20_4_ = fVar197 * fVar117;
      fVar121 = auVar10._24_4_;
      auVar23._24_4_ = fVar198 * fVar121;
      auVar23._28_4_ = auVar12._28_4_;
      auVar113 = vsubps_avx(auVar23,auVar22);
      auVar24._4_4_ = fVar175 * fVar183;
      auVar24._0_4_ = fVar173 * fVar5;
      auVar24._8_4_ = fVar176 * fVar81;
      auVar24._12_4_ = fVar177 * fVar101;
      auVar24._16_4_ = fVar178 * fVar107;
      auVar24._20_4_ = fVar179 * fVar117;
      auVar24._24_4_ = fVar180 * fVar121;
      auVar24._28_4_ = auVar12._28_4_;
      auVar25._4_4_ = fVar167 * fVar6;
      auVar25._0_4_ = fVar163 * fVar3;
      auVar25._8_4_ = fVar168 * fVar190;
      auVar25._12_4_ = fVar169 * fVar97;
      auVar25._16_4_ = fVar170 * fVar103;
      auVar25._20_4_ = fVar171 * fVar109;
      auVar25._24_4_ = fVar172 * fVar118;
      auVar25._28_4_ = auVar10._28_4_;
      _local_5c00 = vsubps_avx(auVar25,auVar24);
      auVar123 = vsubps_avx(auVar89,*(undefined1 (*) [32])ray);
      auVar84 = vsubps_avx(auVar131,*(undefined1 (*) [32])(ray + 0x20));
      auVar128 = vsubps_avx(auVar147,*(undefined1 (*) [32])(ray + 0x40));
      uStack_5a88._4_4_ = (float)((ulong)uVar41 >> 0x20);
      fVar155 = auVar128._0_4_;
      fVar157 = auVar128._4_4_;
      auVar26._4_4_ = fVar157 * local_5aa0._4_4_;
      auVar26._0_4_ = fVar155 * (float)local_5aa0;
      fVar158 = auVar128._8_4_;
      auVar26._8_4_ = fVar158 * (float)uStack_5a98;
      fVar159 = auVar128._12_4_;
      auVar26._12_4_ = fVar159 * uStack_5a98._4_4_;
      fVar160 = auVar128._16_4_;
      auVar26._16_4_ = fVar160 * (float)uStack_5a90;
      fVar161 = auVar128._20_4_;
      auVar26._20_4_ = fVar161 * uStack_5a90._4_4_;
      fVar162 = auVar128._24_4_;
      auVar26._24_4_ = fVar162 * (float)uStack_5a88;
      auVar26._28_4_ = fVar2;
      fVar125 = auVar84._0_4_;
      fVar133 = auVar84._4_4_;
      auVar27._4_4_ = fVar133 * local_5ac0._4_4_;
      auVar27._0_4_ = fVar125 * (float)local_5ac0;
      fVar135 = auVar84._8_4_;
      auVar27._8_4_ = fVar135 * (float)uStack_5ab8;
      fVar137 = auVar84._12_4_;
      auVar27._12_4_ = fVar137 * uStack_5ab8._4_4_;
      fVar186 = auVar84._16_4_;
      auVar27._16_4_ = fVar186 * (float)uStack_5ab0;
      fVar140 = auVar84._20_4_;
      auVar27._20_4_ = fVar140 * uStack_5ab0._4_4_;
      fVar142 = auVar84._24_4_;
      auVar27._24_4_ = fVar142 * (float)uStack_5aa8;
      auVar27._28_4_ = auVar11._28_4_;
      auVar128 = vsubps_avx(auVar27,auVar26);
      fVar82 = auVar123._0_4_;
      fVar98 = auVar123._4_4_;
      auVar28._4_4_ = fVar98 * local_5ac0._4_4_;
      auVar28._0_4_ = fVar82 * (float)local_5ac0;
      fVar100 = auVar123._8_4_;
      auVar28._8_4_ = fVar100 * (float)uStack_5ab8;
      fVar102 = auVar123._12_4_;
      auVar28._12_4_ = fVar102 * uStack_5ab8._4_4_;
      fVar104 = auVar123._16_4_;
      auVar28._16_4_ = fVar104 * (float)uStack_5ab0;
      fVar106 = auVar123._20_4_;
      auVar28._20_4_ = fVar106 * uStack_5ab0._4_4_;
      fVar108 = auVar123._24_4_;
      auVar28._24_4_ = fVar108 * (float)uStack_5aa8;
      auVar28._28_4_ = fVar2;
      auVar185._0_4_ = fVar155 * local_5ae0;
      auVar185._4_4_ = fVar157 * fStack_5adc;
      auVar185._8_4_ = fVar158 * fStack_5ad8;
      auVar185._12_4_ = fVar159 * fStack_5ad4;
      auVar185._16_4_ = fVar160 * fStack_5ad0;
      auVar185._20_4_ = fVar161 * fStack_5acc;
      auVar185._24_4_ = fVar162 * fStack_5ac8;
      auVar185._28_36_ = auVar187;
      auVar129 = vsubps_avx(auVar185._0_32_,auVar28);
      auVar29._4_4_ = fVar133 * fStack_5adc;
      auVar29._0_4_ = fVar125 * local_5ae0;
      auVar29._8_4_ = fVar135 * fStack_5ad8;
      auVar29._12_4_ = fVar137 * fStack_5ad4;
      auVar29._16_4_ = fVar186 * fStack_5ad0;
      auVar29._20_4_ = fVar140 * fStack_5acc;
      auVar29._24_4_ = fVar142 * fStack_5ac8;
      auVar29._28_4_ = fVar2;
      auVar30._4_4_ = fVar98 * local_5aa0._4_4_;
      auVar30._0_4_ = fVar82 * (float)local_5aa0;
      auVar30._8_4_ = fVar100 * (float)uStack_5a98;
      auVar30._12_4_ = fVar102 * uStack_5a98._4_4_;
      auVar30._16_4_ = fVar104 * (float)uStack_5a90;
      auVar30._20_4_ = fVar106 * uStack_5a90._4_4_;
      auVar30._24_4_ = fVar108 * (float)uStack_5a88;
      auVar30._28_4_ = fVar189;
      auVar145 = vsubps_avx(auVar30,auVar29);
      auVar148._0_4_ =
           auVar112._0_4_ * local_5ae0 +
           auVar113._0_4_ * (float)local_5aa0 + local_5c00._0_4_ * (float)local_5ac0;
      auVar148._4_4_ =
           auVar112._4_4_ * fStack_5adc +
           auVar113._4_4_ * local_5aa0._4_4_ + local_5c00._4_4_ * local_5ac0._4_4_;
      auVar148._8_4_ =
           auVar112._8_4_ * fStack_5ad8 +
           auVar113._8_4_ * (float)uStack_5a98 + local_5c00._8_4_ * (float)uStack_5ab8;
      auVar148._12_4_ =
           auVar112._12_4_ * fStack_5ad4 +
           auVar113._12_4_ * uStack_5a98._4_4_ + local_5c00._12_4_ * uStack_5ab8._4_4_;
      auVar148._16_4_ =
           auVar112._16_4_ * fStack_5ad0 +
           auVar113._16_4_ * (float)uStack_5a90 + local_5c00._16_4_ * (float)uStack_5ab0;
      auVar148._20_4_ =
           auVar112._20_4_ * fStack_5acc +
           auVar113._20_4_ * uStack_5a90._4_4_ + local_5c00._20_4_ * uStack_5ab0._4_4_;
      auVar148._24_4_ =
           auVar112._24_4_ * fStack_5ac8 +
           auVar113._24_4_ * (float)uStack_5a88 + local_5c00._24_4_ * (float)uStack_5aa8;
      auVar148._28_4_ = fVar2 + uStack_5a88._4_4_ + fVar2;
      auVar174._8_4_ = 0x80000000;
      auVar174._0_8_ = 0x8000000080000000;
      auVar174._12_4_ = 0x80000000;
      auVar174._16_4_ = 0x80000000;
      auVar174._20_4_ = 0x80000000;
      auVar174._24_4_ = 0x80000000;
      auVar174._28_4_ = 0x80000000;
      auVar84 = vandps_avx(auVar174,auVar148);
      uVar126 = auVar84._0_4_;
      auVar166._0_4_ =
           uVar126 ^ (uint)(fVar163 * auVar128._0_4_ +
                           fVar173 * auVar129._0_4_ + fVar191 * auVar145._0_4_);
      uVar132 = auVar84._4_4_;
      auVar166._4_4_ =
           uVar132 ^ (uint)(fVar167 * auVar128._4_4_ +
                           fVar175 * auVar129._4_4_ + fVar193 * auVar145._4_4_);
      uVar134 = auVar84._8_4_;
      auVar166._8_4_ =
           uVar134 ^ (uint)(fVar168 * auVar128._8_4_ +
                           fVar176 * auVar129._8_4_ + fVar194 * auVar145._8_4_);
      uVar136 = auVar84._12_4_;
      auVar166._12_4_ =
           uVar136 ^ (uint)(fVar169 * auVar128._12_4_ +
                           fVar177 * auVar129._12_4_ + fVar195 * auVar145._12_4_);
      uVar138 = auVar84._16_4_;
      auVar166._16_4_ =
           uVar138 ^ (uint)(fVar170 * auVar128._16_4_ +
                           fVar178 * auVar129._16_4_ + fVar196 * auVar145._16_4_);
      uVar139 = auVar84._20_4_;
      auVar166._20_4_ =
           uVar139 ^ (uint)(fVar171 * auVar128._20_4_ +
                           fVar179 * auVar129._20_4_ + fVar197 * auVar145._20_4_);
      uVar141 = auVar84._24_4_;
      auVar166._24_4_ =
           uVar141 ^ (uint)(fVar172 * auVar128._24_4_ +
                           fVar180 * auVar129._24_4_ + fVar198 * auVar145._24_4_);
      uVar143 = auVar84._28_4_;
      auVar166._28_4_ =
           uVar143 ^ (uint)(auVar111._28_4_ + auVar65._28_4_ + uStack_5a88._4_4_ + fVar2);
      auVar84 = vcmpps_avx(auVar166,_DAT_01faff00,5);
      in_ZMM15 = ZEXT3264(auVar84);
      auVar111 = _local_5d00 & auVar84;
      bVar64 = true;
      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0x7f,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar111 >> 0xbf,0) != '\0') ||
          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar111[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar84,_local_5d00);
        in_ZMM15 = ZEXT3264(auVar84);
        fVar2 = auVar113._28_4_;
        auVar154._0_4_ =
             uVar126 ^ (uint)(auVar128._0_4_ * fVar5 +
                             auVar129._0_4_ * fVar3 + auVar145._0_4_ * fVar4);
        auVar154._4_4_ =
             uVar132 ^ (uint)(auVar128._4_4_ * fVar183 +
                             auVar129._4_4_ * fVar6 + auVar145._4_4_ * fVar7);
        auVar154._8_4_ =
             uVar134 ^ (uint)(auVar128._8_4_ * fVar81 +
                             auVar129._8_4_ * fVar190 + auVar145._8_4_ * fVar192);
        auVar154._12_4_ =
             uVar136 ^ (uint)(auVar128._12_4_ * fVar101 +
                             auVar129._12_4_ * fVar97 + auVar145._12_4_ * fVar99);
        auVar154._16_4_ =
             uVar138 ^ (uint)(auVar128._16_4_ * fVar107 +
                             auVar129._16_4_ * fVar103 + auVar145._16_4_ * fVar105);
        auVar154._20_4_ =
             uVar139 ^ (uint)(auVar128._20_4_ * fVar117 +
                             auVar129._20_4_ * fVar109 + auVar145._20_4_ * fVar116);
        auVar154._24_4_ =
             uVar141 ^ (uint)(auVar128._24_4_ * fVar121 +
                             auVar129._24_4_ * fVar118 + auVar145._24_4_ * fVar119);
        auVar154._28_4_ = uVar143 ^ (uint)(auVar112._28_4_ + fVar2 + auVar96._28_4_);
        auVar111 = vcmpps_avx(auVar154,_DAT_01faff00,5);
        auVar65 = auVar84 & auVar111;
        if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0x7f,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar65 >> 0xbf,0) != '\0') ||
            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar65[0x1f] < '\0') {
          auVar70._8_4_ = 0x7fffffff;
          auVar70._0_8_ = 0x7fffffff7fffffff;
          auVar70._12_4_ = 0x7fffffff;
          auVar70._16_4_ = 0x7fffffff;
          auVar70._20_4_ = 0x7fffffff;
          auVar70._24_4_ = 0x7fffffff;
          auVar70._28_4_ = 0x7fffffff;
          auVar65 = vandps_avx(auVar148,auVar70);
          auVar84 = vandps_avx(auVar111,auVar84);
          auVar128 = vsubps_avx(auVar65,auVar166);
          auVar111 = vcmpps_avx(auVar128,auVar154,5);
          auVar129 = auVar84 & auVar111;
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0x7f,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0xbf,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar129[0x1f] < '\0') {
            auVar84 = vandps_avx(auVar111,auVar84);
            auVar71._0_4_ =
                 uVar126 ^ (uint)(fVar82 * auVar112._0_4_ +
                                 fVar155 * local_5c00._0_4_ + fVar125 * auVar113._0_4_);
            auVar71._4_4_ =
                 uVar132 ^ (uint)(fVar98 * auVar112._4_4_ +
                                 fVar157 * local_5c00._4_4_ + fVar133 * auVar113._4_4_);
            auVar71._8_4_ =
                 uVar134 ^ (uint)(fVar100 * auVar112._8_4_ +
                                 fVar158 * local_5c00._8_4_ + fVar135 * auVar113._8_4_);
            auVar71._12_4_ =
                 uVar136 ^ (uint)(fVar102 * auVar112._12_4_ +
                                 fVar159 * local_5c00._12_4_ + fVar137 * auVar113._12_4_);
            auVar71._16_4_ =
                 uVar138 ^ (uint)(fVar104 * auVar112._16_4_ +
                                 fVar160 * local_5c00._16_4_ + fVar186 * auVar113._16_4_);
            auVar71._20_4_ =
                 uVar139 ^ (uint)(fVar106 * auVar112._20_4_ +
                                 fVar161 * local_5c00._20_4_ + fVar140 * auVar113._20_4_);
            auVar71._24_4_ =
                 uVar141 ^ (uint)(fVar108 * auVar112._24_4_ +
                                 fVar162 * local_5c00._24_4_ + fVar142 * auVar113._24_4_);
            auVar71._28_4_ = uVar143 ^ (uint)(fVar2 + auVar128._28_4_ + fVar2);
            auVar33._4_4_ = auVar65._4_4_ * local_5b00._4_4_;
            auVar33._0_4_ = auVar65._0_4_ * (float)local_5b00;
            auVar33._8_4_ = auVar65._8_4_ * (float)uStack_5af8;
            auVar33._12_4_ = auVar65._12_4_ * uStack_5af8._4_4_;
            auVar33._16_4_ = auVar65._16_4_ * (float)uStack_5af0;
            auVar33._20_4_ = auVar65._20_4_ * uStack_5af0._4_4_;
            auVar33._24_4_ = auVar65._24_4_ * (float)uStack_5ae8;
            auVar33._28_4_ = fVar2;
            auVar111 = vcmpps_avx(auVar33,auVar71,1);
            auVar34._4_4_ = auVar65._4_4_ * local_5b20._4_4_;
            auVar34._0_4_ = auVar65._0_4_ * (float)local_5b20;
            auVar34._8_4_ = auVar65._8_4_ * (float)uStack_5b18;
            auVar34._12_4_ = auVar65._12_4_ * uStack_5b18._4_4_;
            auVar34._16_4_ = auVar65._16_4_ * (float)uStack_5b10;
            auVar34._20_4_ = auVar65._20_4_ * uStack_5b10._4_4_;
            auVar34._24_4_ = auVar65._24_4_ * (float)uStack_5b08;
            auVar34._28_4_ = auVar123._28_4_;
            auVar65 = vcmpps_avx(auVar71,auVar34,2);
            auVar111 = vandps_avx(auVar65,auVar111);
            auVar65 = auVar84 & auVar111;
            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar65 >> 0x7f,0) != '\0') ||
                  (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0xbf,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar65[0x1f] < '\0') {
              auVar84 = vandps_avx(auVar84,auVar111);
              auVar111 = vcmpps_avx(auVar148,_DAT_01faff00,4);
              auVar65 = auVar84 & auVar111;
              if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar65 >> 0x7f,0) != '\0') ||
                    (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar65 >> 0xbf,0) != '\0') ||
                  (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar65[0x1f] < '\0') {
                uVar126 = ((context->scene->geometries).items[uVar61].ptr)->mask;
                auVar93._4_4_ = uVar126;
                auVar93._0_4_ = uVar126;
                auVar93._8_4_ = uVar126;
                auVar93._12_4_ = uVar126;
                auVar93._16_4_ = uVar126;
                auVar93._20_4_ = uVar126;
                auVar93._24_4_ = uVar126;
                auVar93._28_4_ = uVar126;
                auVar84 = vandps_avx(auVar111,auVar84);
                auVar111 = vandps_avx(auVar93,*(undefined1 (*) [32])pRVar1);
                auVar181 = vpcmpeqd_avx(auVar111._16_16_,ZEXT816(0) << 0x20);
                auVar188 = vpcmpeqd_avx(auVar111._0_16_,ZEXT816(0) << 0x20);
                auVar94._16_16_ = auVar181;
                auVar94._0_16_ = auVar84._0_16_;
                auVar111 = vblendps_avx(ZEXT1632(auVar188),auVar94,0xf0);
                auVar65 = auVar84 & ~auVar111;
                if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar65 >> 0x7f,0) != '\0') ||
                      (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar65 >> 0xbf,0) != '\0') ||
                    (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar65[0x1f] < '\0') {
                  auVar84 = vandnps_avx(auVar111,auVar84);
                  auVar111 = _local_5d00 & ~auVar84;
                  auVar75 = vandnps_avx(auVar84,_local_5d00);
                  bVar64 = (((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                || (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                               (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || SUB321(auVar111 >> 0x7f,0) != '\0') ||
                             (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            SUB321(auVar111 >> 0xbf,0) != '\0') ||
                           (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           auVar111[0x1f] < '\0';
                }
              }
            }
          }
        }
      }
      auVar111 = _local_5d00;
      _local_5be0 = auVar12;
      _local_5bc0 = auVar11;
      _local_5ba0 = auVar10;
      if ((!bVar64) || (bVar64 = 2 < uVar59, uVar59 = uVar59 + 1, auVar84 = auVar75, bVar64)) break;
    }
    _local_5d00 = auVar111;
    auVar181 = local_5cc0._0_16_;
    auVar87 = vandps_avx(auVar75,local_5cc0);
    auVar75 = local_5cc0 & auVar75;
    if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar75 >> 0x7f,0) == '\0') &&
          (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar75 >> 0xbf,0) == '\0') &&
        (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar75[0x1f])
    break;
  }
  auVar72._0_8_ = auVar87._0_8_ ^ 0xffffffffffffffff;
  auVar72._8_4_ = auVar87._8_4_ ^ 0xffffffff;
  auVar72._12_4_ = auVar87._12_4_ ^ 0xffffffff;
  auVar72._16_4_ = auVar87._16_4_ ^ 0xffffffff;
  auVar72._20_4_ = auVar87._20_4_ ^ 0xffffffff;
  auVar72._24_4_ = auVar87._24_4_ ^ 0xffffffff;
  auVar72._28_4_ = auVar87._28_4_ ^ 0xffffffff;
  local_5b20 = uVar45;
  uStack_5b18 = uVar46;
  uStack_5b10 = uVar47;
  local_5b00 = uVar35;
  uStack_5af8 = uVar36;
  uStack_5af0 = uVar37;
  local_5ac0 = uVar42;
  uStack_5ab8 = uVar43;
  uStack_5ab0 = uVar44;
  local_5aa0 = uVar38;
  uStack_5a98 = uVar39;
  uStack_5a90 = uVar40;
  uStack_5a88 = uVar41;
LAB_00432895:
  _local_5c80 = vorps_avx(_local_5c80,auVar72);
  auVar181 = vpcmpeqd_avx(auVar181,auVar181);
  auVar188 = vpcmpgtd_avx(local_5c80._16_16_,auVar181);
  auVar181 = vpcmpgtd_avx(local_5c80._0_16_,auVar181);
  auVar181 = vpor_avx(auVar181,auVar188);
  if ((((auVar181 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar181 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar181 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar181[0xf])
  goto LAB_004329f9;
  auVar78._8_4_ = 0xff800000;
  auVar78._0_8_ = 0xff800000ff800000;
  auVar78._12_4_ = 0xff800000;
  auVar78._16_4_ = 0xff800000;
  auVar78._20_4_ = 0xff800000;
  auVar78._24_4_ = 0xff800000;
  auVar78._28_4_ = 0xff800000;
  auVar96 = ZEXT3264(local_58e0);
  local_58e0 = vblendvps_avx(local_58e0,auVar78,_local_5c80);
  goto LAB_00431e89;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }